

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O0

void __thiscall SDLFB::Update(SDLFB *this)

{
  bool bVar1;
  int iVar2;
  float fVar3;
  float local_4c;
  float local_44;
  float local_3c;
  int local_28;
  int iStack_24;
  bool Windowed;
  int y;
  int pitch;
  void *pixels;
  SDLFB *pSStack_10;
  int semValue;
  SDLFB *this_local;
  
  if ((this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.LockCount == 1) {
    pSStack_10 = this;
    DFrameBuffer::DrawRateStuff(&this->super_DFrameBuffer);
    iVar2 = FIntCVar::operator_cast_to_int(&vid_maxfps);
    if ((iVar2 != 0) && (bVar1 = FBoolCVar::operator_cast_to_bool(&cl_capfps), !bVar1)) {
      do {
        do {
          iVar2 = sem_wait((sem_t *)&FPSLimitSemaphore);
        } while (iVar2 != 0);
        sem_getvalue((sem_t *)&FPSLimitSemaphore,(int *)((long)&pixels + 4));
      } while (0 < pixels._4_4_);
    }
    (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Buffer = (BYTE *)0x0;
    (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.LockCount = 0;
    this->UpdatePending = false;
    cycle_t::Reset(&BlitCycles);
    cycle_t::Reset(&SDLFlipCycles);
    cycle_t::Clock(&BlitCycles);
    if ((this->UsingRenderer & 1U) == 0) {
      iVar2 = SDL_LockSurface((this->field_8).Texture);
      if (iVar2 != 0) {
        return;
      }
      _y = ((this->field_8).Surface)->pixels;
      iStack_24 = ((this->field_8).Surface)->pitch;
    }
    else {
      iVar2 = SDL_LockTexture((this->field_8).Texture,0,&y,&stack0xffffffffffffffdc);
      if (iVar2 != 0) {
        return;
      }
    }
    if ((this->NotPaletted & 1U) == 0) {
      if (iStack_24 == (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Pitch) {
        memcpy(_y,(this->super_DFrameBuffer).super_DSimpleCanvas.MemBuffer,
               (long)((this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Width *
                     (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Height));
      }
      else {
        for (local_28 = 0;
            local_28 < (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Height;
            local_28 = local_28 + 1) {
          memcpy((void *)((long)_y + (long)(local_28 * iStack_24)),
                 (this->super_DFrameBuffer).super_DSimpleCanvas.MemBuffer +
                 local_28 * (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Pitch,
                 (long)(this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Width);
        }
      }
    }
    else {
      (*GPfx.Convert)((this->super_DFrameBuffer).super_DSimpleCanvas.MemBuffer,
                      (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Pitch,_y,
                      iStack_24,(this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Width,
                      (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Height,0x10000,
                      0x10000,0,0);
    }
    if ((this->UsingRenderer & 1U) == 0) {
      SDL_UnlockSurface((this->field_8).Texture);
      cycle_t::Clock(&SDLFlipCycles);
      SDL_UpdateWindowSurface(this->Screen);
      cycle_t::Unclock(&SDLFlipCycles);
    }
    else {
      SDL_UnlockTexture((this->field_8).Texture);
      cycle_t::Clock(&SDLFlipCycles);
      SDL_RenderClear(this->Renderer);
      SDL_RenderCopy(this->Renderer,(this->field_8).Texture,0);
      SDL_RenderPresent(this->Renderer);
      cycle_t::Unclock(&SDLFlipCycles);
    }
    cycle_t::Unclock(&BlitCycles);
    if ((this->NeedGammaUpdate & 1U) != 0) {
      this->NeedGammaUpdate = false;
      fVar3 = FFloatCVar::operator_cast_to_float(&rgamma);
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        local_3c = this->Gamma;
        fVar3 = FFloatCVar::operator_cast_to_float(&rgamma);
        local_3c = local_3c * fVar3;
      }
      else {
        local_3c = this->Gamma;
      }
      DCanvas::CalcGamma((DCanvas *)this,local_3c,this->GammaTable[0]);
      fVar3 = FFloatCVar::operator_cast_to_float(&ggamma);
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        local_44 = this->Gamma;
        fVar3 = FFloatCVar::operator_cast_to_float(&ggamma);
        local_44 = local_44 * fVar3;
      }
      else {
        local_44 = this->Gamma;
      }
      DCanvas::CalcGamma((DCanvas *)this,local_44,this->GammaTable[1]);
      fVar3 = FFloatCVar::operator_cast_to_float(&bgamma);
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        local_4c = this->Gamma;
        fVar3 = FFloatCVar::operator_cast_to_float(&bgamma);
        local_4c = local_4c * fVar3;
      }
      else {
        local_4c = this->Gamma;
      }
      DCanvas::CalcGamma((DCanvas *)this,local_4c,this->GammaTable[2]);
      this->NeedPalUpdate = true;
    }
    if ((this->NeedPalUpdate & 1U) != 0) {
      this->NeedPalUpdate = false;
      UpdateColors(this);
    }
  }
  else if (0 < (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.LockCount) {
    this->UpdatePending = true;
    (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.LockCount =
         (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.LockCount + -1;
  }
  return;
}

Assistant:

void SDLFB::Update ()
{
	if (LockCount != 1)
	{
		if (LockCount > 0)
		{
			UpdatePending = true;
			--LockCount;
		}
		return;
	}

	DrawRateStuff ();

#ifndef __APPLE__
	if(vid_maxfps && !cl_capfps)
	{
		SEMAPHORE_WAIT(FPSLimitSemaphore)
	}
#endif

	Buffer = NULL;
	LockCount = 0;
	UpdatePending = false;

	BlitCycles.Reset();
	SDLFlipCycles.Reset();
	BlitCycles.Clock();

	void *pixels;
	int pitch;
	if (UsingRenderer)
	{
		if (SDL_LockTexture (Texture, NULL, &pixels, &pitch))
			return;
	}
	else
	{
		if (SDL_LockSurface (Surface))
			return;

		pixels = Surface->pixels;
		pitch = Surface->pitch;
	}

	if (NotPaletted)
	{
		GPfx.Convert (MemBuffer, Pitch,
			pixels, pitch, Width, Height,
			FRACUNIT, FRACUNIT, 0, 0);
	}
	else
	{
		if (pitch == Pitch)
		{
			memcpy (pixels, MemBuffer, Width*Height);
		}
		else
		{
			for (int y = 0; y < Height; ++y)
			{
				memcpy ((BYTE *)pixels+y*pitch, MemBuffer+y*Pitch, Width);
			}
		}
	}

	if (UsingRenderer)
	{
		SDL_UnlockTexture (Texture);

		SDLFlipCycles.Clock();
		SDL_RenderClear(Renderer);
		SDL_RenderCopy(Renderer, Texture, NULL, NULL);
		SDL_RenderPresent(Renderer);
		SDLFlipCycles.Unclock();
	}
	else
	{
		SDL_UnlockSurface (Surface);

		SDLFlipCycles.Clock();
		SDL_UpdateWindowSurface (Screen);
		SDLFlipCycles.Unclock();
	}

	BlitCycles.Unclock();

	if (NeedGammaUpdate)
	{
		bool Windowed = false;
		NeedGammaUpdate = false;
		CalcGamma ((Windowed || rgamma == 0.f) ? Gamma : (Gamma * rgamma), GammaTable[0]);
		CalcGamma ((Windowed || ggamma == 0.f) ? Gamma : (Gamma * ggamma), GammaTable[1]);
		CalcGamma ((Windowed || bgamma == 0.f) ? Gamma : (Gamma * bgamma), GammaTable[2]);
		NeedPalUpdate = true;
	}
	
	if (NeedPalUpdate)
	{
		NeedPalUpdate = false;
		UpdateColors ();
	}
}